

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# initialalignment.cpp
# Opt level: O2

bool __thiscall Alignment::StaticAlignmentMean(Alignment *this)

{
  Vector3d *m;
  double dVar1;
  double __x;
  ostream *poVar2;
  long lVar3;
  int iVar4;
  Matrix3d *dst;
  Alignment *this_00;
  bool bVar5;
  byte bVar6;
  double local_218;
  Matrix3d *local_210;
  Matrix3d *local_208;
  Matrix<double,_3,_1,_0,_3,_1> local_1f8;
  Matrix<double,_3,_1,_0,_3,_1> local_1d8;
  Vector3d vb;
  Matrix<double,_3,_1,_0,_3,_1> local_1a0;
  Matrix3d Cnb;
  Matrix3d observation;
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_const_Eigen::Inverse<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
  temp;
  Matrix3d reference;
  
  bVar6 = 0;
  CalculateMean(this);
  m = this->Mean;
  poVar2 = Eigen::operator<<((ostream *)&std::cout,
                             (DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)m);
  std::endl<char,std::char_traits<char>>(poVar2);
  local_1d8.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0] =
       0.0;
  local_1d8.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1] =
       0.0;
  local_1d8.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2] =
       -9.7936174;
  dVar1 = Deg2Rad(30.5278);
  dVar1 = cos(dVar1);
  __x = Deg2Rad(30.5278);
  local_1a0.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2] =
       sin(__x);
  local_1a0.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1] =
       0.0;
  local_1a0.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2] =
       local_1a0.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
       [2] * -7.292115e-05;
  local_1a0.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0] =
       dVar1 * 7.292115e-05;
  local_1f8.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0] =
       local_1a0.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
       [2] * 0.0 + 0.0;
  local_1f8.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1] =
       local_1a0.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
       [0] * -9.7936174 +
       local_1a0.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
       [2] * -0.0;
  local_1f8.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2] =
       local_1a0.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
       [0] * -0.0 + 0.0;
  Eigen::MatrixBase<Eigen::Matrix<double,3,1,0,3,1>>::cross<Eigen::Matrix<double,3,1,0,3,1>>
            ((MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)m,
             (MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)(this->Mean + 1));
  Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_-1,_-1,_false>::Block
            ((Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,__1,__1,_false> *)&observation,&reference,0
             ,0,3,1);
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,_1,_1,false>,Eigen::Matrix<double,3,1,0,3,1>>
            ((Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,__1,__1,_false> *)&observation,&local_1d8);
  Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_-1,_-1,_false>::Block
            ((Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,__1,__1,_false> *)&observation,&reference,0
             ,1,3,1);
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,_1,_1,false>,Eigen::Matrix<double,3,1,0,3,1>>
            ((Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,__1,__1,_false> *)&observation,&local_1a0);
  Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_-1,_-1,_false>::Block
            ((Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,__1,__1,_false> *)&observation,&reference,0
             ,2,3,1);
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,_1,_1,false>,Eigen::Matrix<double,3,1,0,3,1>>
            ((Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,__1,__1,_false> *)&observation,&local_1f8);
  Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_-1,_-1,_false>::Block
            ((Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,__1,__1,_false> *)&Cnb,&observation,0,0,3,1
            );
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,_1,_1,false>,Eigen::Matrix<double,3,1,0,3,1>>
            ((Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,__1,__1,_false> *)&Cnb,m);
  Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_-1,_-1,_false>::Block
            ((Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,__1,__1,_false> *)&Cnb,&observation,0,1,3,1
            );
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,_1,_1,false>,Eigen::Matrix<double,3,1,0,3,1>>
            ((Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,__1,__1,_false> *)&Cnb,
             (Matrix<double,_3,_1,_0,_3,_1> *)(this->Mean + 1));
  Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_-1,_-1,_false>::Block
            ((Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,__1,__1,_false> *)&Cnb,&observation,0,2,3,1
            );
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,_1,_1,false>,Eigen::Matrix<double,3,1,0,3,1>>
            ((Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,__1,__1,_false> *)&Cnb,&vb);
  temp._0_8_ = &reference;
  temp.m_lhs.m_lhs = &observation;
  Eigen::PlainObjectBase<Eigen::Matrix<double,3,3,0,3,3>>::
  _set_noalias<Eigen::Product<Eigen::Inverse<Eigen::Transpose<Eigen::Matrix<double,3,3,0,3,3>>>,Eigen::Transpose<Eigen::Matrix<double,3,3,0,3,3>>,0>>
            ((PlainObjectBase<Eigen::Matrix<double,3,3,0,3,3>> *)&Cnb,
             (DenseBase<Eigen::Product<Eigen::Inverse<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>,_Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_0>_>
              *)&temp);
  dst = &this->Cbn;
  Eigen::internal::call_assignment<Eigen::Matrix<double,3,3,0,3,3>,Eigen::Matrix<double,3,3,0,3,3>>
            (dst,&Cnb);
  iVar4 = 0x1e;
  while (bVar5 = iVar4 != 0, iVar4 = iVar4 + -1, bVar5) {
    local_218 = 0.5;
    local_210 = dst;
    local_208 = dst;
    Eigen::
    MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Matrix<double,3,3,0,3,3>const,Eigen::Inverse<Eigen::Transpose<Eigen::Matrix<double,3,3,0,3,3>>>const>>
    ::operator*(&temp,(MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Matrix<double,3,3,0,3,3>const,Eigen::Inverse<Eigen::Transpose<Eigen::Matrix<double,3,3,0,3,3>>>const>>
                       *)&local_210,&local_218);
    Eigen::internal::
    call_assignment<Eigen::Matrix<double,3,3,0,3,3>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Matrix<double,3,3,0,3,3>const,Eigen::Inverse<Eigen::Transpose<Eigen::Matrix<double,3,3,0,3,3>>>const>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,3,0,3,3>const>const>>
              (dst,&temp);
  }
  this_00 = (Alignment *)&stack0xffffffffffffff88;
  for (lVar3 = 9; lVar3 != 0; lVar3 = lVar3 + -1) {
    this_00->OriginData[0].
    super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
    ._M_impl.super__Vector_impl_data._M_start =
         (pointer)(dst->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                  m_data.array[0];
    dst = (Matrix3d *)((long)dst + (ulong)bVar6 * -0x10 + 8);
    this_00 = (Alignment *)((long)this_00 + (ulong)bVar6 * -0x10 + 8);
  }
  CalculateEuler(this_00,(Matrix3d *)&stack0xffffffffffffff88,this->Euler_mean);
  return true;
}

Assistant:

bool Alignment::StaticAlignmentMean()
{
    this->CalculateMean();
    cout << this->Mean[0] << endl;
    Vector3d gn(0, 0, -GRAVITY);
    Vector3d Omega_n(OMEGA * cos(Deg2Rad(PHI)), 0, -OMEGA * sin(Deg2Rad(PHI)));
    Vector3d vn = gn.cross(Omega_n);
    Vector3d vb = this->Mean[0].cross(this->Mean[1]);

    Matrix3d reference;
    reference.block(0, 0, 3, 1) = gn;
    reference.block(0, 1, 3, 1) = Omega_n;
    reference.block(0, 2, 3, 1) = vn;
    
    Matrix3d observation;
    observation.block(0, 0, 3, 1) = this->Mean[0];
    observation.block(0, 1, 3, 1) = this->Mean[1];
    observation.block(0, 2, 3, 1) = vb;
    try
    {
        Matrix3d Cnb = reference.transpose().inverse() * observation.transpose();
        this->Cbn = Cnb;
        for(int i = 0; i < 30; ++i)
        {
            auto temp = (this->Cbn + (Cbn.transpose()).inverse()) * 0.5;
            this->Cbn = temp;
        }

        this->CalculateEuler(Cbn, this->Euler_mean);
    }
    catch(const std::exception& e)
    {
        std::cout << e.what() << '\n';
        return false;
    }

    return true;
}